

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

int proxy_authorize_callsign(proxy_handle *ph,char *callsign)

{
  void *pvVar1;
  regex_handle *prVar2;
  int iVar3;
  char *pcVar4;
  char *fmt;
  
  pvVar1 = ph->priv;
  prVar2 = *(regex_handle **)((long)pvVar1 + 0x830);
  if (prVar2 != (regex_handle *)0x0) {
    iVar3 = regex_is_match(prVar2,callsign);
    if (iVar3 != 0) {
      if (-1 < iVar3) {
        return 0;
      }
      fmt = "Failed to match callsign \'%s\' against denial pattern (%d): %s\n";
      goto LAB_001040b1;
    }
  }
  prVar2 = *(regex_handle **)((long)pvVar1 + 0x828);
  if (prVar2 == (regex_handle *)0x0) {
    return 1;
  }
  iVar3 = regex_is_match(prVar2,callsign);
  if (iVar3 == 1) {
    return 1;
  }
  if (-1 < iVar3) {
    return 0;
  }
  fmt = "Failed to match callsign \'%s\' against allowing pattern (%d): %s\n";
LAB_001040b1:
  pcVar4 = strerror(-iVar3);
  proxy_log(ph,LOG_LEVEL_WARN,fmt,callsign,(ulong)(uint)-iVar3,pcVar4);
  return 0;
}

Assistant:

int proxy_authorize_callsign(struct proxy_handle *ph,
			     const char *callsign)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	if (priv->re_calls_denied != NULL) {
		ret = regex_is_match(priv->re_calls_denied, callsign);
		if (ret != 0) {
			if (ret < 0)
				proxy_log(ph, LOG_LEVEL_WARN,
					  "Failed to match callsign '%s' against denial pattern (%d): %s\n",
					  callsign, -ret, strerror(-ret));

			return 0;
		}
	}

	if (priv->re_calls_allowed != NULL) {
		ret = regex_is_match(priv->re_calls_allowed, callsign);
		if (ret != 1) {
			if (ret < 0)
				proxy_log(ph, LOG_LEVEL_WARN,
					  "Failed to match callsign '%s' against allowing pattern (%d): %s\n",
					  callsign, -ret, strerror(-ret));

			return 0;
		}
	}

	return 1;
}